

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::multisample::
MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition>::uploadVertexData
          (MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition> *this,
          Allocation *vertexBufferAllocation,VertexDataDesc *vertexDataDescripton)

{
  uint uVar1;
  uint uVar2;
  void *dst;
  VertexDataNdcScreen *src;
  Vector<float,_2> local_11c;
  Vector<float,_4> local_114;
  VertexDataNdcScreen local_104;
  Vector<float,_2> local_ec;
  Vector<float,_4> local_e4;
  VertexDataNdcScreen local_d4;
  Vector<float,_2> local_bc;
  Vector<float,_4> local_b4;
  VertexDataNdcScreen local_a4;
  Vector<float,_2> local_8c [2];
  Vector<float,_4> local_78;
  VertexDataNdcScreen local_68;
  undefined1 local_50 [8];
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  vertices;
  float screenSizeY;
  float screenSizeX;
  UVec3 layerSize;
  VertexDataDesc *vertexDataDescripton_local;
  Allocation *vertexBufferAllocation_local;
  MSInstance<vkt::pipeline::multisample::MSInstanceInterpolateScreenPosition> *this_local;
  
  layerSize.m_data._4_8_ = vertexDataDescripton;
  getLayerSize((multisample *)&screenSizeY,IMAGE_TYPE_2D,
               &(this->super_MSInstanceBaseResolve).super_MultisampleInstanceBase.m_imageMSParams.
                imageSize);
  uVar1 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)&screenSizeY);
  uVar2 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)&screenSizeY);
  vertices.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (float)uVar2;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::vector((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
            *)local_50);
  tcu::Vector<float,_4>::Vector(&local_78,-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_2>::Vector(local_8c,0.0,0.0);
  VertexDataNdcScreen::VertexDataNdcScreen(&local_68,&local_78,local_8c);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
               *)local_50,&local_68);
  tcu::Vector<float,_4>::Vector(&local_b4,1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_2>::Vector(&local_bc,(float)uVar1,0.0);
  VertexDataNdcScreen::VertexDataNdcScreen(&local_a4,&local_b4,&local_bc);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
               *)local_50,&local_a4);
  tcu::Vector<float,_4>::Vector(&local_e4,-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_2>::Vector
            (&local_ec,0.0,
             vertices.
             super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  VertexDataNdcScreen::VertexDataNdcScreen(&local_d4,&local_e4,&local_ec);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
               *)local_50,&local_d4);
  tcu::Vector<float,_4>::Vector(&local_114,1.0,1.0,0.0,1.0);
  tcu::Vector<float,_2>::Vector
            (&local_11c,(float)uVar1,
             vertices.
             super__Vector_base<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  VertexDataNdcScreen::VertexDataNdcScreen(&local_104,&local_114,&local_11c);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
               *)local_50,&local_104);
  dst = ::vk::Allocation::getHostPtr(vertexBufferAllocation);
  src = dataPointer<vkt::pipeline::multisample::VertexDataNdcScreen>
                  ((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
                    *)local_50);
  ::deMemcpy(dst,src,*(size_t *)(layerSize.m_data._4_8_ + 0x10));
  std::
  vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
  ::~vector((vector<vkt::pipeline::multisample::VertexDataNdcScreen,_std::allocator<vkt::pipeline::multisample::VertexDataNdcScreen>_>
             *)local_50);
  return;
}

Assistant:

void MSInstance<MSInstanceInterpolateScreenPosition>::uploadVertexData (const Allocation& vertexBufferAllocation, const VertexDataDesc& vertexDataDescripton) const
{
	const tcu::UVec3 layerSize		= getLayerSize(IMAGE_TYPE_2D, m_imageMSParams.imageSize);
	const float		 screenSizeX	= static_cast<float>(layerSize.x());
	const float		 screenSizeY	= static_cast<float>(layerSize.y());

	std::vector<VertexDataNdcScreen> vertices;

	vertices.push_back(VertexDataNdcScreen(tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec2(0.0f, 0.0f)));
	vertices.push_back(VertexDataNdcScreen(tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f), tcu::Vec2(screenSizeX, 0.0f)));
	vertices.push_back(VertexDataNdcScreen(tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f), tcu::Vec2(0.0f, screenSizeY)));
	vertices.push_back(VertexDataNdcScreen(tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f), tcu::Vec2(screenSizeX, screenSizeY)));

	deMemcpy(vertexBufferAllocation.getHostPtr(), dataPointer(vertices), static_cast<std::size_t>(vertexDataDescripton.dataSize));
}